

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_0::DummyService::request
          (DummyService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  bool bVar1;
  Promise<void> *pPVar2;
  char (*params) [25];
  long lVar3;
  PromiseNode *extraout_RDX;
  char *pcVar4;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar5;
  undefined4 in_register_00000034;
  Array<kj::Promise<void>_> *pAVar6;
  Array<char> *this_00;
  Promise<void> PVar7;
  long *in_stack_00000010;
  Promise<void> sendPromise;
  Own<kj::WebSocket> ws;
  Array<kj::Promise<void>_> result;
  String body;
  Own<kj::_::PromiseNode> local_1c8;
  StringPtr url_local;
  ArrayBuilder<kj::Promise<void>_> promises;
  Array<char> local_48;
  undefined1 local_30 [8];
  long local_28;
  
  params = (char (*) [25])url.content.size_;
  url_local.content.ptr = (char *)params;
  url_local.content.size_ = (size_t)headers;
  bVar1 = HttpHeaders::isWebSocket((HttpHeaders *)requestBody);
  if (bVar1) {
    HttpHeaders::HttpHeaders
              ((HttpHeaders *)&promises,
               *(HttpHeaderTable **)(CONCAT44(in_register_00000034,method) + 8));
    (**(code **)(*in_stack_00000010 + 8))(&ws,in_stack_00000010,(HttpHeaders *)&promises);
    HttpHeaders::~HttpHeaders((HttpHeaders *)&promises);
    pPVar2 = (Promise<void> *)requestBody[1]._vptr_AsyncInputStream[0x17];
    bVar1 = (Promise<void> *)0x1 < pPVar2;
    if (bVar1) {
      promises.pos = (RemoveConst<kj::Promise<void>_> *)requestBody[1]._vptr_AsyncInputStream[0x16];
      promises.endPtr = pPVar2;
    }
    promises.ptr = (Promise<void> *)CONCAT71(promises.ptr._1_7_,bVar1);
    result.ptr = (Promise<void> *)anon_var_dwarf_24a72c;
    result.size_ = 5;
    pAVar6 = &result;
    if (bVar1) {
      pAVar6 = (Array<kj::Promise<void>_> *)&promises.pos;
    }
    str<kj::StringPtr,char_const(&)[2],kj::StringPtr&>
              (&body,(kj *)pAVar6,(StringPtr *)0x37b904,(char (*) [2])&url_local,
               (StringPtr *)headers);
    pcVar4 = (char *)body.content.size_;
    if (body.content.size_ != 0) {
      pcVar4 = body.content.ptr;
    }
    lVar3 = 0;
    if (body.content.size_ != 0) {
      lVar3 = body.content.size_ - 1;
    }
    (*(ws.ptr)->_vptr_WebSocket[1])(&sendPromise,ws.ptr,pcVar4,lVar3);
    pPVar2 = _::HeapArrayDisposer::allocateUninitialized<kj::Promise<void>>(2);
    promises.endPtr = pPVar2 + 2;
    promises.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    promises.ptr = pPVar2;
    promises.pos = pPVar2;
    Promise<void>::attach<kj::String>((Promise<void> *)&result,(String *)&sendPromise);
    (pPVar2->super_PromiseBase).node.disposer = (Disposer *)result.ptr;
    (pPVar2->super_PromiseBase).node.ptr = (PromiseNode *)result.size_;
    result.size_ = 0;
    promises.pos = pPVar2 + 1;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result);
    (*(ws.ptr)->_vptr_WebSocket[6])(&local_1c8);
    Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ignoreResult
              ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)
               &result);
    ((promises.pos)->super_PromiseBase).node.disposer = (Disposer *)result.ptr;
    ((promises.pos)->super_PromiseBase).node.ptr = (PromiseNode *)result.size_;
    result.size_ = 0;
    promises.pos = promises.pos + 1;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result);
    Own<kj::_::PromiseNode>::dispose(&local_1c8);
    result.size_ = (long)promises.pos - (long)promises.ptr >> 4;
    result.ptr = promises.ptr;
    result.disposer = promises.disposer;
    promises.ptr = (Promise<void> *)0x0;
    promises.pos = (RemoveConst<kj::Promise<void>_> *)0x0;
    promises.endPtr = (Promise<void> *)0x0;
    joinPromises((kj *)&local_1c8,&result);
    Promise<void>::attach<kj::Own<kj::WebSocket>>
              ((Promise<void> *)this,(Own<kj::WebSocket> *)&local_1c8);
    Own<kj::_::PromiseNode>::dispose(&local_1c8);
    Array<kj::Promise<void>_>::~Array(&result);
    ArrayBuilder<kj::Promise<void>_>::dispose(&promises);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&sendPromise);
    Array<char>::~Array(&body.content);
    Own<kj::WebSocket>::dispose(&ws);
    pPVar5 = extraout_RDX;
  }
  else {
    promises.ptr = (Promise<void> *)anon_var_dwarf_24a683;
    promises.pos = (RemoveConst<kj::Promise<void>_> *)&DAT_00000007;
    bVar1 = StringPtr::operator==(&url_local,(StringPtr *)&promises);
    if (bVar1) {
      _::Debug::makeDescription<char_const(&)[25]>
                ((String *)&local_48,(Debug *)"\"client requested failure\"",
                 "client requested failure",params);
      Exception::Exception
                ((Exception *)&promises,FAILED,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0xb37,(String *)&local_48);
      Promise<void>::Promise((Promise<void> *)this,(Exception *)&promises);
      Exception::~Exception((Exception *)&promises);
      this_00 = &local_48;
    }
    else {
      pPVar2 = (Promise<void> *)requestBody[1]._vptr_AsyncInputStream[0x17];
      bVar1 = (Promise<void> *)0x1 < pPVar2;
      if (bVar1) {
        promises.pos = (RemoveConst<kj::Promise<void>_> *)
                       requestBody[1]._vptr_AsyncInputStream[0x16];
        promises.endPtr = pPVar2;
      }
      promises.ptr = (Promise<void> *)CONCAT71(promises.ptr._1_7_,bVar1);
      result.ptr = (Promise<void> *)anon_var_dwarf_24a72c;
      result.size_ = 5;
      pAVar6 = &result;
      if (bVar1) {
        pAVar6 = (Array<kj::Promise<void>_> *)&promises.pos;
      }
      str<kj::StringPtr,char_const(&)[2],kj::StringPtr&>
                (&body,(kj *)pAVar6,(StringPtr *)0x37b904,(char (*) [2])&url_local,
                 (StringPtr *)headers);
      HttpHeaders::HttpHeaders
                ((HttpHeaders *)&promises,
                 *(HttpHeaderTable **)(CONCAT44(in_register_00000034,method) + 8));
      local_28 = 0;
      if (body.content.size_ != 0) {
        local_28 = body.content.size_ - 1;
      }
      local_30[0] = 1;
      (**(code **)*in_stack_00000010)(&ws,in_stack_00000010,200,"OK",3,&promises,local_30);
      HttpHeaders::~HttpHeaders((HttpHeaders *)&promises);
      pPVar2 = _::HeapArrayDisposer::allocateUninitialized<kj::Promise<void>>(2);
      promises.endPtr = pPVar2 + 2;
      promises.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      pcVar4 = (char *)body.content.size_;
      if (body.content.size_ != 0) {
        pcVar4 = body.content.ptr;
      }
      lVar3 = 0;
      if (body.content.size_ != 0) {
        lVar3 = body.content.size_ - 1;
      }
      promises.ptr = pPVar2;
      promises.pos = pPVar2;
      (**(ws.ptr)->_vptr_WebSocket)(&result,ws.ptr,pcVar4,lVar3);
      (pPVar2->super_PromiseBase).node.disposer = (Disposer *)result.ptr;
      (pPVar2->super_PromiseBase).node.ptr = (PromiseNode *)result.size_;
      result.size_ = 0;
      promises.pos = pPVar2 + 1;
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result);
      AsyncInputStream::readAllBytes((AsyncInputStream *)&sendPromise,(uint64_t)response);
      Promise<kj::Array<unsigned_char>_>::ignoreResult
                ((Promise<kj::Array<unsigned_char>_> *)&result);
      ((promises.pos)->super_PromiseBase).node.disposer = (Disposer *)result.ptr;
      ((promises.pos)->super_PromiseBase).node.ptr = (PromiseNode *)result.size_;
      result.size_ = 0;
      promises.pos = promises.pos + 1;
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&result);
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&sendPromise);
      result.size_ = (long)promises.pos - (long)promises.ptr >> 4;
      result.ptr = promises.ptr;
      result.disposer = promises.disposer;
      promises.ptr = (Promise<void> *)0x0;
      promises.pos = (RemoveConst<kj::Promise<void>_> *)0x0;
      promises.endPtr = (Promise<void> *)0x0;
      joinPromises((kj *)&sendPromise,&result);
      Promise<void>::attach<kj::Own<kj::AsyncOutputStream>,kj::String>
                ((Promise<void> *)this,(Own<kj::AsyncOutputStream> *)&sendPromise,(String *)&ws);
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&sendPromise);
      Array<kj::Promise<void>_>::~Array(&result);
      ArrayBuilder<kj::Promise<void>_>::dispose(&promises);
      Own<kj::AsyncOutputStream>::dispose((Own<kj::AsyncOutputStream> *)&ws);
      this_00 = &body.content;
    }
    Array<char>::~Array(this_00);
    pPVar5 = extraout_RDX_00;
  }
  PVar7.super_PromiseBase.node.ptr = pPVar5;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    if (!headers.isWebSocket()) {
      if (url == "/throw") {
        return KJ_EXCEPTION(FAILED, "client requested failure");
      }

      auto body = kj::str(headers.get(HttpHeaderId::HOST).orDefault("null"), ":", url);
      auto stream = response.send(200, "OK", HttpHeaders(headerTable), body.size());
      auto promises = kj::heapArrayBuilder<kj::Promise<void>>(2);
      promises.add(stream->write(body.begin(), body.size()));
      promises.add(requestBody.readAllBytes().ignoreResult());
      return kj::joinPromises(promises.finish()).attach(kj::mv(stream), kj::mv(body));
    } else {
      auto ws = response.acceptWebSocket(HttpHeaders(headerTable));
      auto body = kj::str(headers.get(HttpHeaderId::HOST).orDefault("null"), ":", url);
      auto sendPromise = ws->send(body);

      auto promises = kj::heapArrayBuilder<kj::Promise<void>>(2);
      promises.add(sendPromise.attach(kj::mv(body)));
      promises.add(ws->receive().ignoreResult());
      return kj::joinPromises(promises.finish()).attach(kj::mv(ws));
    }
  }